

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O2

void __thiscall EventQueue::Flush(EventQueue *this)

{
  Node *pNVar1;
  Event *this_00;
  AutoLock _auto_lock_;
  AutoLock local_30;
  
  AutoLock::AutoLock(&local_30,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0xb4);
  while (pNVar1 = ((this->mQueue).mHead)->next, pNVar1 != (this->mQueue).mTail) {
    this_00 = pNVar1->val;
    JetHead::list<Event_*>::pop_front(&this->mQueue);
    RefCount::Release(&this_00->super_RefCount);
  }
  AutoLock::~AutoLock(&local_30);
  return;
}

Assistant:

void EventQueue::Flush()
{
	DebugAutoLock( mLock );

	// Scan through all events, remove them from the queue and
	// release a reference from them.
	while (not mQueue.empty())
	{
		Event* temp = mQueue.front();
		mQueue.pop_front();
		temp->Release();
	}
}